

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O3

int __thiscall
google::protobuf::io::FileInputStream::CopyingFileInputStream::Read
          (CopyingFileInputStream *this,void *buffer,int size)

{
  LogMessage *other;
  ssize_t sVar1;
  int *piVar2;
  int iVar3;
  LogMessage local_68;
  LogFinisher local_29;
  
  if (this->is_closed_ == true) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/io/zero_copy_stream_impl.cc"
               ,0x84);
    other = internal::LogMessage::operator<<(&local_68,"CHECK failed: !is_closed_: ");
    internal::LogFinisher::operator=(&local_29,other);
    internal::LogMessage::~LogMessage(&local_68);
  }
  do {
    sVar1 = read(this->file_,buffer,(long)size);
    iVar3 = (int)sVar1;
    if (-1 < iVar3) {
      return iVar3;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  this->errno_ = *piVar2;
  return iVar3;
}

Assistant:

int FileInputStream::CopyingFileInputStream::Read(void* buffer, int size) {
  GOOGLE_CHECK(!is_closed_);

  int result;
  do {
    result = read(file_, buffer, size);
  } while (result < 0 && errno == EINTR);

  if (result < 0) {
    // Read error (not EOF).
    errno_ = errno;
  }

  return result;
}